

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetFileSuffix
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          ArtifactType artifact)

{
  ArtifactType artifact_00;
  bool bVar1;
  string *psVar2;
  undefined1 local_b0 [8];
  string base;
  undefined1 local_88 [8];
  string prefix;
  allocator<char> local_51;
  string local_50;
  cmValue local_30;
  cmValue suffix_1;
  ArtifactType artifact_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  string *suffix;
  
  suffix_1.Value._4_4_ = artifact;
  bVar1 = IsImported(this);
  artifact_00 = suffix_1.Value._4_4_;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_51);
    local_30 = GetFileSuffixInternal(this,config,artifact_00,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    bVar1 = cmValue::operator_cast_to_bool(&local_30);
    if (bVar1) {
      psVar2 = cmValue::operator*[abi_cxx11_(&local_30);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
  }
  else {
    std::__cxx11::string::string((string *)local_88);
    base.field_2._M_local_buf[0xf] = '\0';
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::string::string((string *)local_b0);
    GetFullNameInternal(this,config,suffix_1.Value._4_4_,(string *)local_88,(string *)local_b0,
                        __return_storage_ptr__);
    base.field_2._M_local_buf[0xf] = '\x01';
    std::__cxx11::string::~string((string *)local_b0);
    if ((base.field_2._M_local_buf[0xf] & 1U) == 0) {
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
    std::__cxx11::string::~string((string *)local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetFileSuffix(
  const std::string& config, cmStateEnums::ArtifactType artifact) const
{
  if (this->IsImported()) {
    cmValue suffix = this->GetFileSuffixInternal(config, artifact);
    return suffix ? *suffix : std::string();
  }

  std::string prefix;
  std::string suffix;
  std::string base;
  this->GetFullNameInternal(config, artifact, prefix, base, suffix);
  return suffix;
}